

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void signFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  sqlite3_context *in_RDI;
  double dVar2;
  double x;
  int type0;
  uint iVal;
  sqlite3_value *in_stack_ffffffffffffffd0;
  
  iVar1 = sqlite3_value_numeric_type(in_stack_ffffffffffffffd0);
  if ((iVar1 == 1) || (iVar1 == 2)) {
    dVar2 = sqlite3_value_double((sqlite3_value *)0x2267fa);
    if (0.0 <= dVar2) {
      iVal = (uint)(0.0 < dVar2);
    }
    else {
      iVal = 0xffffffff;
    }
    sqlite3_result_int(in_RDI,iVal);
  }
  return;
}

Assistant:

static void signFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int type0;
  double x;
  UNUSED_PARAMETER(argc);
  assert( argc==1 );
  type0 = sqlite3_value_numeric_type(argv[0]);
  if( type0!=SQLITE_INTEGER && type0!=SQLITE_FLOAT ) return;
  x = sqlite3_value_double(argv[0]);
  sqlite3_result_int(context, x<0.0 ? -1 : x>0.0 ? +1 : 0);
}